

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O3

prsndef * prsfold(prscxdef *ctx,prsndef *node)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  prsndef *ppVar6;
  int *piVar7;
  prsndef *ppVar8;
  ulong uVar9;
  int iVar10;
  byte bVar11;
  long lVar12;
  byte *pbVar13;
  bool bVar14;
  tokdef t;
  tokdef local_a0;
  
  if (node->prsntyp == 0x3b) {
    bVar14 = true;
    iVar10 = 0;
    ppVar8 = node;
    do {
      while( true ) {
        ppVar6 = prsfold(ctx,(ppVar8->prsnv).prsnvn[0]);
        (ppVar8->prsnv).prsnvn[0] = ppVar6;
        if (ppVar6->prsnnlf == 0) break;
        iVar10 = iVar10 + 1;
        ppVar8 = (ppVar8->prsnv).prsnvn[1];
        bVar14 = false;
        if (ppVar8 == (prsndef *)0x0) {
          return node;
        }
      }
      iVar1 = (ppVar6->prsnv).prsnvt.toktyp;
      uVar5 = iVar1 - 0x36;
      if ((0x1f < uVar5) || ((0x81c00007U >> (uVar5 & 0x1f) & 1) == 0)) {
        bVar14 = false;
      }
      if (iVar1 == 0x38) {
        if (((ppVar6->prsnv).prsnvt.toksym.tokstyp & 0xfe) == 4) {
          bVar14 = false;
        }
        prsdef(ctx,&(ppVar6->prsnv).prsnvt,7);
      }
      iVar10 = iVar10 + 1;
      ppVar8 = (ppVar8->prsnv).prsnvn[1];
    } while (ppVar8 != (prsndef *)0x0);
    if (!bVar14) {
      return node;
    }
    piVar7 = (int *)prsbalo(ctx,iVar10 * 0x10 | 8);
    local_a0.toktyp = 0x4c;
    local_a0.tokofs = ((short)piVar7 - (short)ctx) - 0xd0;
    ppVar8 = prsnew0(ctx,&local_a0);
    *piVar7 = iVar10;
    pbVar13 = (byte *)(piVar7 + 2);
    do {
      ppVar6 = (node->prsnv).prsnvn[0];
      bVar11 = *(byte *)&ppVar6->prsnv;
      *pbVar13 = bVar11;
      if (bVar11 < 0x4c) {
        if (bVar11 == 0x36) {
LAB_0011edac:
          uVar9 = (ulong)(ppVar6->prsnv).prsnvt.tokofs;
        }
        else {
          if (bVar11 != 0x38) goto LAB_0011edb2;
          bVar11 = (ppVar6->prsnv).prsnvt.toksym.tokstyp - 1;
          if ((0xd < bVar11) || ((0x20c7U >> (bVar11 & 0x1f) & 1) == 0)) {
            errsigf(ctx->prscxerr,"TADS",0x193);
          }
          *pbVar13 = (&DAT_0013a376)[bVar11];
          uVar9 = (ulong)*(ushort *)((long)&ppVar6->prsnv + 0x42);
        }
      }
      else {
        if ((bVar11 == 0x55) || (bVar11 == 0x4c)) goto LAB_0011edac;
LAB_0011edb2:
        uVar9 = (ppVar6->prsnv).prsnvt.tokval;
      }
      *(ulong *)(pbVar13 + 8) = uVar9;
      node = (node->prsnv).prsnvn[1];
      pbVar13 = pbVar13 + 0x10;
      if (node == (prsndef *)0x0) {
        return ppVar8;
      }
    } while( true );
  }
  iVar10 = node->prsnnlf;
  if (iVar10 == 0) {
    return node;
  }
  bVar11 = 1;
  lVar12 = 0;
  do {
    ppVar8 = prsfold(ctx,*(prsndef **)((long)&node->prsnv + lVar12 * 8));
    *(prsndef **)((long)&node->prsnv + lVar12 * 8) = ppVar8;
    if (((ppVar8->prsnnlf != 0) || (uVar5 = (ppVar8->prsnv).prsnvt.toktyp - 0x36, 0x1f < uVar5)) ||
       ((0x81c00003U >> (uVar5 & 0x1f) & 1) == 0)) {
      bVar11 = 0;
    }
    lVar12 = lVar12 + 1;
  } while (iVar10 != (int)lVar12);
  iVar10 = node->prsnnlf;
  if (!(bool)(iVar10 != 0 & bVar11)) {
    return node;
  }
  if (iVar10 == 1) {
    ppVar8 = (node->prsnv).prsnvn[0];
    iVar10 = (ppVar8->prsnv).prsnvt.toktyp;
    uVar9 = (ppVar8->prsnv).prsnvt.tokval;
    iVar1 = node->prsntyp;
    if (iVar1 < 6) {
      if (iVar1 == 2) goto LAB_0011f04f;
      if (iVar1 != 3) {
        return node;
      }
      if (iVar10 != 0x37) goto LAB_0011f06d;
      uVar9 = -uVar9;
    }
    else {
      if (iVar1 == 6) {
        if (iVar10 - 0x4dU < 2) {
          bVar14 = iVar10 == 0x4d;
        }
        else {
          if (iVar10 != 0x37) goto LAB_0011f06d;
          bVar14 = uVar9 == 0;
        }
        (ppVar8->prsnv).prsnvt.toktyp = bVar14 + 0x4d;
        goto LAB_0011f04f;
      }
      if (iVar1 != 0x1e) {
        return node;
      }
      if (iVar10 != 0x37) goto LAB_0011f06d;
      uVar9 = ~uVar9;
    }
    (ppVar8->prsnv).prsnvt.tokval = uVar9;
    goto LAB_0011f04f;
  }
  if (iVar10 != 2) {
    if (iVar10 != 3) {
      return node;
    }
    iVar10 = ((node->prsnv).prsnvn[0]->prsnv).prsnvt.toktyp;
    if (iVar10 == 0x37) {
      if (((node->prsnv).prsnvn[0]->prsnv).prsnvt.tokval == 0) goto LAB_0011eeb7;
    }
    else {
      if (iVar10 == 0x4d) {
LAB_0011eeb7:
        return (node->prsnv).prsnvn[2];
      }
      if (iVar10 != 0x4e) goto LAB_0011f06d;
    }
    return (prsndef *)(node->prsnv).prsnvt.tokval;
  }
  ppVar8 = (node->prsnv).prsnvn[0];
  uVar9 = (ppVar8->prsnv).prsnvt.tokval;
  uVar3 = ((node->prsnv).prsnvn[1]->prsnv).prsnvt.tokval;
  iVar10 = (ppVar8->prsnv).prsnvt.toktyp;
  iVar1 = ((node->prsnv).prsnvn[1]->prsnv).prsnvt.toktyp;
  iVar2 = node->prsntyp;
  switch(iVar2 + -2) {
  case 0:
  case 1:
    if (iVar1 == 0x4c) {
      return node;
    }
    if (iVar10 == 0x36) {
      return node;
    }
    if (iVar10 == 0x4c) {
      return node;
    }
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
    if (iVar10 != 0x37) {
      return node;
    }
    if (iVar1 != 0x37) {
      return node;
    }
    break;
  case 2:
  case 3:
  case 0xb:
  case 0xf:
  case 0x10:
    break;
  case 4:
  case 0xc:
  case 0xd:
    goto LAB_0011ef52;
  case 0xe:
    if ((iVar1 - 0x4dU | iVar10 - 0x4dU) < 2) {
      bVar14 = (iVar1 == 0x4e) != (iVar10 == 0x4e);
      goto LAB_0011efb7;
    }
    break;
  default:
    if (1 < iVar2 - 0x41U) {
      return node;
    }
    if (((1 < iVar10 - 0x4dU) && (iVar10 != 0x37)) || ((1 < iVar1 - 0x4dU && (iVar1 != 0x37))))
    goto LAB_0011f06d;
    iVar4 = 0x4e - (uint)(uVar9 == 0);
    if (iVar10 != 0x37) {
      iVar4 = iVar10;
    }
    iVar10 = 0x4e - (uint)(uVar3 == 0);
    if (iVar1 != 0x37) {
      iVar10 = iVar1;
    }
    if (iVar2 == 0x42) {
      bVar14 = iVar4 == 0x4e && iVar10 == 0x4e;
    }
    else {
      bVar14 = iVar4 == 0x4e || iVar10 == 0x4e;
    }
LAB_0011efb7:
    (ppVar8->prsnv).prsnvt.toktyp = bVar14 + 0x4d;
    goto LAB_0011f04f;
  }
  if ((iVar10 != 0x37) || (iVar1 != 0x37)) {
LAB_0011f06d:
    errsigf(ctx->prscxerr,"TADS",0x143);
  }
  switch(iVar2 + -2) {
  case 0:
    uVar9 = uVar9 + uVar3;
    break;
  case 1:
    uVar9 = uVar9 - uVar3;
    break;
  case 2:
    if (uVar3 == 0) {
LAB_0011f081:
      errsigf(ctx->prscxerr,"TADS",0x414);
    }
    uVar9 = (long)uVar9 / (long)uVar3;
    break;
  case 3:
    uVar9 = uVar9 * uVar3;
    break;
  default:
LAB_0011ef52:
    return node;
  case 5:
    uVar5 = (uint)(uVar9 == uVar3);
    goto LAB_0011f045;
  case 6:
    uVar5 = (uint)(uVar9 != uVar3);
    goto LAB_0011f045;
  case 7:
    uVar5 = (uint)((long)uVar3 < (long)uVar9);
    goto LAB_0011f045;
  case 8:
    uVar5 = (uint)((long)uVar3 <= (long)uVar9);
    goto LAB_0011f045;
  case 9:
    uVar5 = (uint)((long)uVar9 < (long)uVar3);
    goto LAB_0011f045;
  case 10:
    uVar5 = (uint)((long)uVar9 <= (long)uVar3);
LAB_0011f045:
    iVar10 = uVar5 + 0x4d;
    goto LAB_0011f048;
  case 0xb:
    if (uVar3 == 0) goto LAB_0011f081;
    uVar9 = (long)uVar9 % (long)uVar3;
    iVar10 = 0x37;
    goto LAB_0011f048;
  case 0xe:
    uVar9 = uVar9 ^ uVar3;
    break;
  case 0xf:
    uVar9 = uVar9 << ((byte)uVar3 & 0x3f);
    break;
  case 0x10:
    uVar9 = (long)uVar9 >> ((byte)uVar3 & 0x3f);
  }
  iVar10 = 0x37;
LAB_0011f048:
  (ppVar8->prsnv).prsnvt.toktyp = iVar10;
  (ppVar8->prsnv).prsnvt.tokval = uVar9;
LAB_0011f04f:
  return (node->prsnv).prsnvn[0];
}

Assistant:

static prsndef *prsfold(prscxdef *ctx, prsndef *node)
{
    int       i;
    prsndef **n;
    int       can_fold;
    int       typ;
    tokdef   *tok1, *tok2;
    int       typ1, typ2;
    long      val1, val2;
    prsndef  *ncur;
    
    can_fold = TRUE;                       /* assume we can do some folding */

    /* if this is a list-construction node, special handling is needed */
    if (node->prsntyp == TOKTRBRACK)
    {
        for (i=0, ncur = node ; ncur ; ++i, ncur = ncur->prsnv.prsnvn[1])
        {
            ncur->prsnv.prsnvn[0] = prsfold(ctx, ncur->prsnv.prsnvn[0]);
            typ = TOKTINVALID;
            if (ncur->prsnv.prsnvn[0]->prsnnlf != 0 ||
                ((typ = ncur->prsnv.prsnvn[0]->prsnv.prsnvt.toktyp)
                 != TOKTNUMBER && typ != TOKTSSTRING && typ != TOKTLIST
                 && typ != TOKTNIL && typ != TOKTTRUE && typ != TOKTPOUND
                 && typ != TOKTSYMBOL))
                can_fold = FALSE;              /* not constant - can't fold */
            
            if (typ == TOKTSYMBOL
                && (ncur->prsnv.prsnvn[0]->prsnv.prsnvt.toksym.tokstyp
                    == TOKSTLOCAL
                    || ncur->prsnv.prsnvn[0]->prsnv.prsnvt.toksym.tokstyp
                    == TOKSTSELF))
                can_fold = FALSE;
            
            if (ncur->prsnv.prsnvn[0]->prsnnlf == 0 && typ == TOKTSYMBOL)
                prsdef(ctx, &ncur->prsnv.prsnvn[0]->prsnv.prsnvt,
                       TOKSTFWDOBJ);
        }
        if (can_fold)
        {
            tokdef    t;
            emtlidef *lst;
            prsndef  *retval;
            emtledef *ele;
            
            lst = (emtlidef *)prsbalo(ctx, (uint)(sizeof(emtlidef) +
                                                 (i - 1) * sizeof(emtledef)));
            t.toktyp = TOKTLIST;
            t.tokofs = ((uchar *)lst) - &ctx->prscxpool[0];
            retval = prsnew0(ctx, &t);
            
            lst->emtlicnt = i;
            
            for (ele = &lst->emtliele[0] ; node ;
                   node = node->prsnv.prsnvn[1], ++ele)
            {
                ncur = node->prsnv.prsnvn[0];
                switch(ele->emtletyp = ncur->prsnv.prsnvt.toktyp)
                {
                case TOKTLIST:
                case TOKTSSTRING:
                case TOKTPOUND:
                    ele->emtleval = ncur->prsnv.prsnvt.tokofs;
                    break;
                    
                case TOKTSYMBOL:
                    switch(ncur->prsnv.prsnvt.toksym.tokstyp)
                    {
                    case TOKSTFUNC:
                    case TOKSTFWDFN:
                        ele->emtletyp = TOKTFUNCTION;
                        break;
                    case TOKSTOBJ:
                    case TOKSTFWDOBJ:
                        ele->emtletyp = TOKTOBJECT;
                        break;
                    case TOKSTPROP:
                        ele->emtletyp = TOKTDOT;
                        break;
                    case TOKSTPROPSPEC:
                        ele->emtletyp = TOKTDOT;
                        break;
                    default:
                        errsig(ctx->prscxerr, ERR_INVLSTE);
                    }
                    ele->emtleval = ncur->prsnv.prsnvt.toksym.toksval;
                    break;
                    
                default:
                    ele->emtleval = ncur->prsnv.prsnvt.tokval;
                    break;
                }
            }

            node = retval;
        }
        return(node);
    }
    
    /*
     *   If we have sub-nodes, try to fold them.  If they fold down to
     *   leaf nodes, we can try to apply the expression to them. 
     */
    for (i = node->prsnnlf, n = &node->prsnv.prsnvn[0] ; i ; ++n, --i)
    {
        *n = prsfold(ctx, *n);
        if ((*n)->prsnnlf != 0 ||
            ((typ = (*n)->prsnv.prsnvt.toktyp) != TOKTNUMBER &&
             typ != TOKTSSTRING && typ != TOKTLIST &&
             typ != TOKTNIL && typ != TOKTTRUE && typ != TOKTPOUND))
            can_fold = FALSE;                  /* not constant - can't fold */
    }

    /* if at a leaf, or subnodes are non-constant, can't fold anything */
    if (node->prsnnlf == 0 || !can_fold) return(node);

    switch(node->prsnnlf)
    {
    case 1:
        tok1 = &node->prsnv.prsnvn[0]->prsnv.prsnvt;
        typ1 = tok1->toktyp;
        val1 = tok1->tokval;
        
        switch(node->prsntyp)
        {
        case TOKTPLUS:
            break;
            
        case TOKTMINUS:
            if (typ1 != TOKTNUMBER)
                errsig(ctx->prscxerr, ERR_INVOP);
            tok1->tokval = -val1;
            break;
            
        case TOKTNOT:
            if (!prsvlog(typ1))
                errsig(ctx->prscxerr, ERR_INVOP);
            tok1->toktyp = (prs2log(typ1, val1) == TOKTNIL ?
                            TOKTTRUE : TOKTNIL);
            break;

        case TOKTTILDE:
            if (typ1 != TOKTNUMBER)
                errsig(ctx->prscxerr, ERR_INVOP);
            tok1->tokval = ~val1;
            break;
            
        default:
            return(node);
        }
        break;
        
    case 2:
        tok1 = &node->prsnv.prsnvn[0]->prsnv.prsnvt;
        tok2 = &node->prsnv.prsnvn[1]->prsnv.prsnvt;
        val1 = tok1->tokval;
        val2 = tok2->tokval;
        typ1 = tok1->toktyp;
        typ2 = tok2->toktyp;
        
        switch(node->prsntyp)
        {
        case TOKTOR:
        case TOKTAND:
            if (!prsvlog(typ1) || !prsvlog(typ2))
                errsig(ctx->prscxerr, ERR_INVOP);
            typ1 = (prs2log(typ1, val1) == TOKTTRUE);
            typ2 = (prs2log(typ2, val2) == TOKTTRUE);

            if (node->prsntyp == TOKTAND) typ1 = typ1 && typ2;
            else                          typ1 = typ1 || typ2;

            tok1->toktyp = (typ1 ? TOKTTRUE : TOKTNIL);
            break;

        case TOKTPLUS:
        case TOKTMINUS:
            if (typ1 == TOKTSSTRING || typ1 == TOKTLIST || typ2 == TOKTLIST)
                return(node);
            /* FALLTHROUGH */
            
        case TOKTEQ:
        case TOKTNE:
        case TOKTGT:
        case TOKTGE:
        case TOKTLT:
        case TOKTLE:
            if (typ1 != TOKTNUMBER || typ2 != TOKTNUMBER)
                return(node);
            /* FALLTHROUGH */

        case TOKTXOR:
            if ((typ1 == TOKTTRUE || typ1 == TOKTNIL)
                && (typ2 == TOKTTRUE || typ2 == TOKTNIL))
            {
                int a, b;

                a = (typ1 == TOKTTRUE ? 1 : 0);
                b = (typ2 == TOKTTRUE ? 1 : 0);
                tok1->toktyp = ((a ^ b) ? TOKTTRUE : TOKTNIL);
                break;
            }
            /* FALLTHROUGH */

        case TOKTDIV:
        case TOKTTIMES:
        case TOKTMOD:
        case TOKTSHL:
        case TOKTSHR:
            if (typ1 != TOKTNUMBER || typ2 != TOKTNUMBER)
                errsig(ctx->prscxerr, ERR_INVOP);
            switch(node->prsntyp)
            {
            case TOKTPLUS:
                val1 += val2;
                break;
            case TOKTMINUS:
                val1 -= val2;
                break;
            case TOKTTIMES:
                val1 *= val2;
                break;
            case TOKTDIV:
                if (val2 == 0)
                    errsig(ctx->prscxerr, ERR_DIVZERO);
                val1 /= val2;
                break;
            case TOKTMOD:
                if (val2 == 0)
                    errsig(ctx->prscxerr, ERR_DIVZERO);
                val1 %= val2;
                break;
            case TOKTXOR:
                val1 ^= val2;
                break;
            case TOKTSHL:
                val1 <<= val2;
                break;
            case TOKTSHR:
                val1 >>= val2;
                break;
            case TOKTEQ:
                typ1 = (val1 == val2 ? TOKTTRUE : TOKTNIL);
                break;
            case TOKTNE:
                typ1 = (val1 != val2 ? TOKTTRUE : TOKTNIL);
                break;
            case TOKTGT:
                typ1 = (val1 > val2 ? TOKTTRUE : TOKTNIL);
                break;
            case TOKTLT:
                typ1 = (val1 < val2 ? TOKTTRUE : TOKTNIL);
                break;
            case TOKTLE:
                typ1 = (val1 <= val2 ? TOKTTRUE : TOKTNIL);
                break;
            case TOKTGE:
                typ1 = (val1 >= val2 ? TOKTTRUE : TOKTNIL);
                break;
                
            default:
                return(node);
            }
            tok1->toktyp = typ1;
            tok1->tokval = val1;
            break;
            
        default:
            return(node);
        }
        break;
        
    case 3:
        tok1 = &node->prsnv.prsnvn[0]->prsnv.prsnvt;
        if (!prsvlog(tok1->toktyp)) errsig(ctx->prscxerr, ERR_INVOP);
        if (prs2log(tok1->toktyp, tok1->tokval) == TOKTTRUE)
            return(node->prsnv.prsnvn[1]);
        else
            return(node->prsnv.prsnvn[2]);
        
    default:
        return(node);
    }

    /* return the first sub-node, which has the folded value */
    return(node->prsnv.prsnvn[0]);
}